

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::dotRS(Forth *this)

{
  undefined1 *this_00;
  long lVar1;
  Cell CVar2;
  uint uVar3;
  ostream *poVar4;
  ulong index;
  
  index = (ulong)(this->rStack).top;
  this_00 = &this->field_0x20;
  CVar2 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
  lVar1 = *(long *)(*(long *)&this->field_0x20 + -0x18);
  if (CVar2 == 8) {
    uVar3 = 0x40;
  }
  else if (CVar2 == 10) {
    uVar3 = 2;
  }
  else {
    uVar3 = (uint)(CVar2 == 0x10) << 3;
  }
  *(uint *)(&this->field_0x38 + lVar1) = *(uint *)(&this->field_0x38 + lVar1) & 0xffffffb5 | uVar3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"<<",2);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,">> ",3);
  if (index != 0) {
    do {
      index = index - 1;
      if (this->writeToTarget == ToStdCout) {
        uVar3 = ForthStack<unsigned_int>::getTop(&this->rStack,index);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        std::ostream::flush();
      }
      else if (this->writeToTarget == ToString) {
        uVar3 = ForthStack<unsigned_int>::getTop(&this->rStack,index);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)this_00,uVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      }
    } while ((int)index != 0);
  }
  return;
}

Assistant:

void dotRS() {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			auto depth = rStack.stackDepth();
			std_cout << SETBASE() << "<<" << depth << ">> ";
			for (auto i = depth; i > 0; --i) {
				switch (writeToTarget) {
				case ToString:
					std_cout << static_cast<SCell>(rStack.getTop(i - 1)) << " ";
					break;
				case ToStdCout:
					std::cout << static_cast<SCell>(rStack.getTop(i - 1)) << " ";
					std::cout.flush();
					break;
				default:
					break;
				}
			}
#endif
		}